

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestSuiteForTestResult
               (ostream *stream,TestResult *result)

{
  ostream *poVar1;
  size_t in_RDX;
  size_t width;
  size_t width_00;
  size_t extraout_RDX;
  size_t width_01;
  size_t width_02;
  size_t width_03;
  size_t width_04;
  TimeInMillis ms;
  size_t width_05;
  TimeInMillis ms_00;
  size_t width_06;
  size_t extraout_RDX_00;
  size_t width_07;
  size_t width_08;
  size_t width_09;
  allocator<char> local_a2;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  string local_60;
  allocator<char> local_39;
  string local_38;
  
  Indent_abi_cxx11_(&local_a0,(internal *)&DAT_00000004,in_RDX);
  poVar1 = std::operator<<(stream,(string *)&local_a0);
  std::operator<<(poVar1,"{\n");
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"testsuite",&local_a2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"name",&local_a1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"NonTestSuiteFailure",&local_39);
  Indent_abi_cxx11_(&local_38,(internal *)&DAT_00000006,width);
  OutputJsonKey(stream,&local_a0,&local_80,&local_60,&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"testsuite",(allocator<char> *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"tests",&local_a2);
  Indent_abi_cxx11_(&local_60,(internal *)&DAT_00000006,width_00);
  OutputJsonKey(stream,&local_a0,&local_80,1,&local_60,true);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  width_07 = extraout_RDX;
  if (FLAGS_gtest_list_tests == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"testsuite",(allocator<char> *)&local_38);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"failures",&local_a2);
    Indent_abi_cxx11_(&local_60,(internal *)&DAT_00000006,width_01);
    OutputJsonKey(stream,&local_a0,&local_80,1,&local_60,true);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"testsuite",(allocator<char> *)&local_38);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"disabled",&local_a2);
    Indent_abi_cxx11_(&local_60,(internal *)&DAT_00000006,width_02);
    OutputJsonKey(stream,&local_a0,&local_80,0,&local_60,true);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"testsuite",(allocator<char> *)&local_38);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"skipped",&local_a2);
    Indent_abi_cxx11_(&local_60,(internal *)&DAT_00000006,width_03);
    OutputJsonKey(stream,&local_a0,&local_80,0,&local_60,true);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"testsuite",(allocator<char> *)&local_38);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"errors",&local_a2);
    Indent_abi_cxx11_(&local_60,(internal *)&DAT_00000006,width_04);
    OutputJsonKey(stream,&local_a0,&local_80,0,&local_60,true);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"testsuite",&local_a2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"time",&local_a1);
    FormatTimeInMillisAsDuration_abi_cxx11_(&local_60,(internal *)result->elapsed_time_,ms);
    Indent_abi_cxx11_(&local_38,(internal *)&DAT_00000006,width_05);
    OutputJsonKey(stream,&local_a0,&local_80,&local_60,&local_38,true);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"testsuite",&local_a2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"timestamp",&local_a1);
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
              (&local_60,(internal *)result->start_timestamp_,ms_00);
    Indent_abi_cxx11_(&local_38,(internal *)&DAT_00000006,width_06);
    OutputJsonKey(stream,&local_a0,&local_80,&local_60,&local_38,true);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    width_07 = extraout_RDX_00;
  }
  Indent_abi_cxx11_(&local_a0,(internal *)&DAT_00000006,width_07);
  poVar1 = std::operator<<(stream,(string *)&local_a0);
  std::operator<<(poVar1,"\"testsuite\": [\n");
  std::__cxx11::string::~string((string *)&local_a0);
  OutputJsonTestCaseForTestResult(stream,result);
  poVar1 = std::operator<<(stream,"\n");
  Indent_abi_cxx11_(&local_a0,(internal *)&DAT_00000006,width_08);
  poVar1 = std::operator<<(poVar1,(string *)&local_a0);
  poVar1 = std::operator<<(poVar1,"]\n");
  Indent_abi_cxx11_(&local_80,(internal *)&DAT_00000004,width_09);
  poVar1 = std::operator<<(poVar1,(string *)&local_80);
  std::operator<<(poVar1,"}");
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestSuiteForTestResult(
    ::std::ostream* stream, const TestResult& result) {
  // Output the boilerplate for a new test suite.
  *stream << Indent(4) << "{\n";
  OutputJsonKey(stream, "testsuite", "name", "NonTestSuiteFailure", Indent(6));
  OutputJsonKey(stream, "testsuite", "tests", 1, Indent(6));
  if (!GTEST_FLAG_GET(list_tests)) {
    OutputJsonKey(stream, "testsuite", "failures", 1, Indent(6));
    OutputJsonKey(stream, "testsuite", "disabled", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "skipped", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "errors", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "time",
                  FormatTimeInMillisAsDuration(result.elapsed_time()),
                  Indent(6));
    OutputJsonKey(stream, "testsuite", "timestamp",
                  FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                  Indent(6));
  }
  *stream << Indent(6) << "\"testsuite\": [\n";

  OutputJsonTestCaseForTestResult(stream, result);

  // Finish the test suite.
  *stream << "\n" << Indent(6) << "]\n" << Indent(4) << "}";
}